

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprSrcCount(Walker *pWalker,Expr *pExpr)

{
  SrcCount *pSVar1;
  SrcList *pSVar2;
  int local_38;
  int nSrc;
  SrcList *pSrc;
  SrcCount *p;
  int i;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  if ((pExpr->op == 0x98) || (pExpr->op == 0x9a)) {
    pSVar1 = (pWalker->u).pSrcCount;
    pSVar2 = pSVar1->pSrc;
    if (pSVar2 == (SrcList *)0x0) {
      local_38 = 0;
    }
    else {
      local_38 = pSVar2->nSrc;
    }
    p._4_4_ = 0;
    while ((p._4_4_ < local_38 && (pExpr->iTable != pSVar2->a[p._4_4_].iCursor))) {
      p._4_4_ = p._4_4_ + 1;
    }
    if (p._4_4_ < local_38) {
      pSVar1->nThis = pSVar1->nThis + 1;
    }
    else {
      pSVar1->nOther = pSVar1->nOther + 1;
    }
  }
  return 0;
}

Assistant:

static int exprSrcCount(Walker *pWalker, Expr *pExpr){
  /* The NEVER() on the second term is because sqlite3FunctionUsesThisSrc()
  ** is always called before sqlite3ExprAnalyzeAggregates() and so the
  ** TK_COLUMNs have not yet been converted into TK_AGG_COLUMN.  If
  ** sqlite3FunctionUsesThisSrc() is used differently in the future, the
  ** NEVER() will need to be removed. */
  if( pExpr->op==TK_COLUMN || NEVER(pExpr->op==TK_AGG_COLUMN) ){
    int i;
    struct SrcCount *p = pWalker->u.pSrcCount;
    SrcList *pSrc = p->pSrc;
    int nSrc = pSrc ? pSrc->nSrc : 0;
    for(i=0; i<nSrc; i++){
      if( pExpr->iTable==pSrc->a[i].iCursor ) break;
    }
    if( i<nSrc ){
      p->nThis++;
    }else{
      p->nOther++;
    }
  }
  return WRC_Continue;
}